

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ut.hpp
# Opt level: O3

printer * __thiscall
boost::ext::ut::v1_1_8::printer::operator<<
          (printer *this,
          eq_<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
          *op)

{
  undefined1 *puVar1;
  size_t local_38;
  char *pcStack_30;
  size_t local_28;
  char *pcStack_20;
  
  puVar1 = &this->field_0x40;
  local_38 = (this->colors_).fail._M_len;
  pcStack_30 = (this->colors_).fail._M_str;
  local_28 = (this->colors_).pass._M_len;
  pcStack_20 = (this->colors_).pass._M_str;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)puVar1,(&pcStack_30)[(ulong)op->value_ * 2],
             (&local_38)[(ulong)op->value_ * 2]);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)puVar1,(op->lhs_)._M_str,(op->lhs_)._M_len);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar1," == ",4);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)puVar1,(op->rhs_)._M_str,(op->rhs_)._M_len);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)puVar1,(this->colors_).none._M_str,(this->colors_).none._M_len);
  return this;
}

Assistant:

auto& operator<<(const detail::eq_<TLhs, TRhs>& op) {
      return (*this << color(op) << op.lhs() << " == " << op.rhs()
                    << colors_.none);
    }